

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtensionHandler.cpp
# Opt level: O0

void __thiscall
irr::video::COpenGL3ExtensionHandler::initExtensionsOld(COpenGL3ExtensionHandler *this)

{
  COpenGL3ExtensionHandler *this_00;
  char *next;
  char *pos;
  char *extensions_string;
  allocator<char> *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  COpenGL3ExtensionHandler *in_stack_ffffffffffffff80;
  allocator<char> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  allocator<char> local_41;
  string local_40 [32];
  COpenGL3ExtensionHandler *local_20;
  string *local_18;
  string *local_10;
  
  local_18 = (string *)(*GL.GetString)(0x1f03);
  local_10 = local_18;
  while( true ) {
    this_00 = (COpenGL3ExtensionHandler *)strchr((char *)local_18,0x20);
    local_20 = this_00;
    if (this_00 == (COpenGL3ExtensionHandler *)0x0) break;
    in_stack_ffffffffffffff78 = local_18;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<char_const*,void>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
               (char *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68
              );
    addExtension(this_00,in_stack_ffffffffffffff78);
    ::std::__cxx11::string::~string(local_40);
    ::std::allocator<char>::~allocator(&local_41);
    local_18 = (string *)
               ((long)&(local_20->super_COGLESCoreExtensionHandler)._vptr_COGLESCoreExtensionHandler
               + 1);
    in_stack_ffffffffffffff80 = this_00;
  }
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  addExtension(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  ::std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
  extensionsLoaded(this);
  return;
}

Assistant:

void COpenGL3ExtensionHandler::initExtensionsOld()
{
	auto extensions_string = reinterpret_cast<const char *>(GL.GetString(GL_EXTENSIONS));
	const char *pos = extensions_string;
	while (const char *next = strchr(pos, ' ')) {
		addExtension(std::string{pos, next});
		pos = next + 1;
	}
	addExtension(pos);
	extensionsLoaded();
}